

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O3

unique_ptr<happly::Property,_std::default_delete<happly::Property>_> * __thiscall
happly::Element::getPropertyPtr(Element *this,string *target)

{
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *puVar1;
  pointer __s2;
  size_t __n;
  Property *pPVar2;
  int iVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *prop;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar6 = (this->properties).
           super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->properties).
           super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    __s2 = (target->_M_dataplus)._M_p;
    __n = target->_M_string_length;
    do {
      pPVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t.
               super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
               super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl;
      if ((pPVar2->name)._M_string_length == __n) {
        if (__n == 0) {
          return puVar6;
        }
        iVar3 = bcmp((pPVar2->name)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) {
          return puVar6;
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"PLY parser: element ",&this->name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar5 = (size_type *)(plVar4 + 2);
  local_90._M_dataplus._M_p = (pointer)*plVar4;
  if ((size_type *)local_90._M_dataplus._M_p == psVar5) {
    local_90.field_2._M_allocated_capacity = *psVar5;
    local_90.field_2._8_8_ = plVar4[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar5;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::operator+(&local_50,&local_90,target);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Property>& getPropertyPtr(const std::string& target) {
    for (std::unique_ptr<Property>& prop : properties) {
      if (prop->name == target) {
        return prop;
      }
    }
    throw std::runtime_error("PLY parser: element " + name + " does not have property " + target);
  }